

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::AttributePack::AttributePack
          (AttributePack *this,TestContext *testCtx,RenderContext *renderCtx,Context *drawContext,
          UVec2 *screenSize,bool useVao,bool logEnabled)

{
  uint width;
  uint height;
  bool logEnabled_local;
  bool useVao_local;
  UVec2 *screenSize_local;
  Context *drawContext_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  AttributePack *this_local;
  
  this->m_testCtx = testCtx;
  this->m_renderCtx = renderCtx;
  this->m_ctx = drawContext;
  std::
  vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
  ::vector(&this->m_arrays);
  this->m_program = (ShaderProgram *)0x0;
  width = tcu::Vector<unsigned_int,_2>::x(screenSize);
  height = tcu::Vector<unsigned_int,_2>::y(screenSize);
  tcu::Surface::Surface(&this->m_screen,width,height);
  this->m_useVao = useVao;
  this->m_logEnabled = logEnabled;
  this->m_programID = 0;
  this->m_vaoID = 0;
  if ((this->m_useVao & 1U) != 0) {
    (*this->m_ctx->_vptr_Context[0x4c])(this->m_ctx,1,&this->m_vaoID);
  }
  return;
}

Assistant:

AttributePack::AttributePack (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, sglr::Context& drawContext, const tcu::UVec2& screenSize, bool useVao, bool logEnabled)
	: m_testCtx		(testCtx)
	, m_renderCtx	(renderCtx)
	, m_ctx			(drawContext)
	, m_program		(DE_NULL)
	, m_screen		(screenSize.x(), screenSize.y())
	, m_useVao		(useVao)
	, m_logEnabled	(logEnabled)
	, m_programID	(0)
	, m_vaoID		(0)
{
	if (m_useVao)
		m_ctx.genVertexArrays(1, &m_vaoID);
}